

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void __thiscall ParseInt64_Both_Test::TestBody(ParseInt64_Both_Test *this)

{
  anon_unknown.dwarf_90916::AssertInt64Equals(0,"0",Both);
  anon_unknown.dwarf_90916::AssertInt64Equals(1000,"1000",Both);
  anon_unknown.dwarf_90916::AssertInt64Equals(0x75bcd15,"123456789",Both);
  anon_unknown.dwarf_90916::AssertInt64Equals(0x7fffffffffffffff,"9223372036854775807",Both);
  anon_unknown.dwarf_90916::AssertInt64Equals(0xffffffffffffffff,"18446744073709551615",Both);
  anon_unknown.dwarf_90916::AssertInt64Equals(0x7fffffffffffffff,"0x7fffffffffffffff",Both);
  anon_unknown.dwarf_90916::AssertInt64Equals(0x8000000000000000,"0x8000000000000000",Both);
  anon_unknown.dwarf_90916::AssertInt64Equals(0xffffffffffffffff,"0xffffffffffffffff",Both);
  return;
}

Assistant:

TEST(ParseInt64, Both) {
  AssertInt64Equals(0, "0");
  AssertInt64Equals(1000, "1000");
  AssertInt64Equals(123456789, "123456789");
  AssertInt64Equals(9223372036854775807ull, "9223372036854775807");
  AssertInt64Equals(18446744073709551615ull, "18446744073709551615");
  AssertInt64Equals(0x7fffffffffffffffull, "0x7fffffffffffffff");
  AssertInt64Equals(0x8000000000000000ull, "0x8000000000000000");
  AssertInt64Equals(0xffffffffffffffffull, "0xffffffffffffffff");
}